

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

ExprList * sqlite3ExprListAppend(Parse *pParse,ExprList *pList,Expr *pExpr)

{
  int iVar1;
  ExprList_item *pEVar2;
  ExprList_item *pItem;
  Expr *pExpr_local;
  ExprList *pList_local;
  Parse *pParse_local;
  
  if (pList == (ExprList *)0x0) {
    pParse_local = (Parse *)sqlite3ExprListAppendNew(pParse->db,pExpr);
  }
  else if (pList->nAlloc < pList->nExpr + 1) {
    pParse_local = (Parse *)sqlite3ExprListAppendGrow(pParse->db,pList,pExpr);
  }
  else {
    iVar1 = pList->nExpr;
    pList->nExpr = iVar1 + 1;
    pEVar2 = pList->a + iVar1;
    pEVar2->pExpr = (Expr *)0x0;
    pEVar2->zEName = (char *)0x0;
    pEVar2->fg = (anon_struct_4_9_b482b7ef_for_fg)0x0;
    pEVar2->u = (anon_union_4_2_6146edf4_for_u)0x0;
    pEVar2->pExpr = pExpr;
    pParse_local = (Parse *)pList;
  }
  return (ExprList *)pParse_local;
}

Assistant:

SQLITE_PRIVATE ExprList *sqlite3ExprListAppend(
  Parse *pParse,          /* Parsing context */
  ExprList *pList,        /* List to which to append. Might be NULL */
  Expr *pExpr             /* Expression to be appended. Might be NULL */
){
  struct ExprList_item *pItem;
  if( pList==0 ){
    return sqlite3ExprListAppendNew(pParse->db,pExpr);
  }
  if( pList->nAlloc<pList->nExpr+1 ){
    return sqlite3ExprListAppendGrow(pParse->db,pList,pExpr);
  }
  pItem = &pList->a[pList->nExpr++];
  *pItem = zeroItem;
  pItem->pExpr = pExpr;
  return pList;
}